

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestComment::Run(ParserTestComment *this)

{
  Test *this_00;
  int iVar1;
  bool condition;
  int iVar2;
  allocator<char> local_59;
  string local_58;
  string local_38;
  int local_14;
  ParserTestComment *pPStack_10;
  int fail_count;
  ParserTestComment *this_local;
  
  pPStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse(&this->super_ParserTest,"# this is a comment\nfoo = not # a comment\n");
  iVar1 = local_14;
  iVar2 = testing::Test::AssertionFailures(g_current_test);
  this_00 = g_current_test;
  if (iVar1 == iVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"foo",&local_59);
    BindingEnv::LookupVariable(&local_38,&(this->super_ParserTest).state.bindings_,&local_58);
    condition = std::operator==("not # a comment",&local_38);
    testing::Test::Check
              (this_00,condition,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
               ,0xd8,"\"not # a comment\" == state.bindings_.LookupVariable(\"foo\")");
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, Comment) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"# this is a comment\n"
"foo = not # a comment\n"));
  EXPECT_EQ("not # a comment", state.bindings_.LookupVariable("foo"));
}